

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9PrintTruth(Abc_Frame_t *pAbc,int argc,char **argv)

{
  FILE *pFile;
  int iVar1;
  int iVar2;
  char *pcVar3;
  word local_48;
  word Truth;
  int local_38;
  int fVerbose;
  int nOutRange;
  int iOutNum;
  int c;
  int i;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fVerbose = 0;
  local_38 = -1;
  Truth._4_4_ = 0;
  _c = argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
LAB_0029f5ef:
  do {
    nOutRange = Extra_UtilGetopt(argv_local._4_4_,_c,"ORvh");
    if (nOutRange == -1) {
      if (pAStack_18->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9PrintTruth(): There is no AIG.\n");
        return 1;
      }
      iVar1 = Gia_ManPiNum(pAStack_18->pGia);
      if (6 < iVar1) {
        Abc_Print(-1,"The number of inputs of the AIG exceeds 6.\n");
        return 1;
      }
      if ((-1 < fVerbose) &&
         (iVar1 = fVerbose + local_38, iVar2 = Gia_ManPoNum(pAStack_18->pGia), iVar1 <= iVar2)) {
        if (local_38 == -1) {
          local_38 = Gia_ManCoNum(pAStack_18->pGia);
        }
        for (iOutNum = fVerbose; iOutNum < fVerbose + local_38; iOutNum = iOutNum + 1) {
          local_48 = Gia_LutComputeTruth6Simple(pAStack_18->pGia,iOutNum);
          printf("Output %8d : ",(ulong)(uint)iOutNum);
          pFile = _stdout;
          iVar1 = Gia_ManCiNum(pAStack_18->pGia);
          Extra_PrintHex(pFile,(uint *)&local_48,iVar1);
          printf("\n");
        }
        return 0;
      }
      Abc_Print(-1,"Abc_CommandAbc9PrintTruth(): Range of outputs to extract is incorrect.\n");
      return 1;
    }
    switch(nOutRange) {
    case 0x4f:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-O\" should be followed by an integer.\n");
        goto LAB_0029f863;
      }
      fVerbose = atoi(_c[globalUtilOptind]);
      iVar1 = fVerbose;
      break;
    default:
      goto LAB_0029f863;
    case 0x52:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_0029f863;
      }
      local_38 = atoi(_c[globalUtilOptind]);
      iVar1 = local_38;
      break;
    case 0x68:
      goto LAB_0029f863;
    case 0x76:
      Truth._4_4_ = Truth._4_4_ ^ 1;
      goto LAB_0029f5ef;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0029f863:
      Abc_Print(-2,"usage: &print_truth [-OR num] [-vh]\n");
      Abc_Print(-2,"\t         prints truth tables of outputs in hex notation\n");
      Abc_Print(-2,"\t-O num : the index of first PO to print [default = %d]\n",
                (ulong)(uint)fVerbose);
      Abc_Print(-2,"\t-R num : (optional) the number of outputs to extract [default = all]\n");
      pcVar3 = "no";
      if (Truth._4_4_ != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9PrintTruth( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern word Gia_LutComputeTruth6Simple( Gia_Man_t * p, int iPo );
    int i, c, iOutNum = 0, nOutRange = -1, fVerbose = 0; word Truth;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutNum < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutRange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutRange < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9PrintTruth(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManPiNum(pAbc->pGia) > 6 )
    {
        Abc_Print( -1, "The number of inputs of the AIG exceeds 6.\n" );
        return 1;
    }
    if ( iOutNum < 0 || iOutNum + nOutRange > Gia_ManPoNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9PrintTruth(): Range of outputs to extract is incorrect.\n" );
        return 1;
    }
    if ( nOutRange == -1 )
        nOutRange = Gia_ManCoNum(pAbc->pGia);
    for ( i = iOutNum; i < iOutNum + nOutRange; i++ )
    {
        Truth = Gia_LutComputeTruth6Simple( pAbc->pGia, i );
        printf( "Output %8d : ", i );
        Extra_PrintHex( stdout, (unsigned *)&Truth, Gia_ManCiNum(pAbc->pGia) );
        printf( "\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &print_truth [-OR num] [-vh]\n" );
    Abc_Print( -2, "\t         prints truth tables of outputs in hex notation\n" );
    Abc_Print( -2, "\t-O num : the index of first PO to print [default = %d]\n", iOutNum );
    Abc_Print( -2, "\t-R num : (optional) the number of outputs to extract [default = all]\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}